

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_input.hpp
# Opt level: O0

void __thiscall MemoryInput::MemoryInput(MemoryInput *this,char *filename)

{
  void *pvVar1;
  undefined1 local_b0 [8];
  stat sb;
  int fd;
  char *filename_local;
  MemoryInput *this_local;
  
  this->_vptr_MemoryInput = (_func_int **)&PTR__MemoryInput_0013ac30;
  sb.__glibc_reserved[2]._4_4_ = open(filename,0);
  fstat(sb.__glibc_reserved[2]._4_4_,(stat *)local_b0);
  this->_size = sb.st_rdev;
  pvVar1 = mmap((void *)0x0,this->_size,1,2,sb.__glibc_reserved[2]._4_4_,0);
  this->_buffer = pvVar1;
  close(sb.__glibc_reserved[2]._4_4_);
  return;
}

Assistant:

MemoryInput(const char *filename) {
    int fd = open(filename, O_RDONLY);
    struct stat sb;
    fstat(fd, &sb);
    _size = sb.st_size;
    _buffer = mmap(nullptr, _size, PROT_READ, MAP_PRIVATE, fd, 0);
    close(fd);
  }